

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pfr.cpp
# Opt level: O3

int R7PfrIter(MatrixXd *Xin,MatrixXd *uin,Vector3d *vk,double r0,
             RSDoublelinCameraPoseVector *results)

{
  PointerType pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  plainobjectbase_evaluator_data<double,_0> pVar6;
  Vector3d *pVVar7;
  RSDoublelinCameraPoseVector *this;
  Index size_4;
  double *pdVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  Index index;
  double dVar14;
  long lVar15;
  Index size_3;
  long lVar16;
  double dVar17;
  int i;
  Index othersize;
  MatrixXd u;
  MatrixXd AR;
  MatrixXd X;
  MatrixXd AA;
  MatrixXd n;
  MatrixXd A;
  RSDoublelinCameraPose res;
  Matrix<std::complex<double>,_4,_10,_0,_4,_10> sols;
  VectorXd r2;
  Matrix<double,_7,_1,_0,_7,_1> mon;
  MatrixXd nn;
  Matrix<double,_35,_1,_0,_35,_1> data;
  assign_op<double,_double> local_5e1;
  plainobjectbase_evaluator_data<double,_0> local_5e0;
  double *local_5d8;
  DenseStorage<double,__1,__1,__1,_0> local_5c8;
  PointerType local_5b0;
  PointerType local_5a8;
  PointerType local_598;
  DenseStorage<double,__1,__1,__1,_0> local_588;
  DenseStorage<double,__1,__1,__1,_0> local_568;
  Matrix<double,__1,__1,_0,__1,__1> local_550;
  value_type local_538;
  undefined1 local_4c8 [16];
  double local_4b8;
  plainobjectbase_evaluator_data<double,_0> local_4b0;
  PointerType local_4a8;
  double *apdStack_4a0 [4];
  variable_if_dynamic<long,__1> local_480;
  PointerType local_478;
  PointerType local_470;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_460;
  PointerType local_458;
  plainobjectbase_evaluator_data<double,_0> local_450;
  scalar_constant_op<double> local_448;
  double *local_440;
  PointerType local_438;
  double *local_430;
  variable_if_dynamic<long,__1> local_428;
  scalar_constant_op<double> local_420;
  PointerType local_418;
  double local_410;
  scalar_constant_op<double> local_408;
  PointerType local_400;
  plainobjectbase_evaluator_data<double,_0> local_3f8;
  scalar_constant_op<double> local_3f0;
  plainobjectbase_evaluator_data<double,_0> local_3e8;
  double *local_3e0;
  double *local_3d8;
  variable_if_dynamic<long,__1> local_3d0;
  scalar_constant_op<double> local_3c8;
  PointerType local_3c0;
  PointerType local_3b8;
  scalar_constant_op<double> local_3b0;
  PointerType local_3a8;
  PointerType local_3a0;
  scalar_constant_op<double> local_398;
  plainobjectbase_evaluator_data<double,_0> local_390;
  double *local_388;
  plainobjectbase_evaluator_data<double,_0> local_380;
  variable_if_dynamic<long,__1> local_378;
  double *local_370;
  PointerType local_368;
  double *local_360;
  variable_if_dynamic<long,__1> local_358;
  double *local_350;
  scalar_constant_op<double> local_340;
  double local_338;
  PointerType local_330;
  scalar_constant_op<double> local_328;
  PointerType local_320;
  PointerType local_318;
  scalar_constant_op<double> local_310;
  double *local_308;
  plainobjectbase_evaluator_data<double,_0> local_300;
  double *local_2f8;
  variable_if_dynamic<long,__1> local_2f0;
  PointerType local_2e8;
  scalar_constant_op<double> local_2e0;
  PointerType local_2d8;
  scalar_constant_op<double> local_2c8;
  double local_2c0;
  double *local_2b8;
  variable_if_dynamic<long,__1> local_2a8;
  PointerType local_2a0;
  plainobjectbase_evaluator_data<double,_0> local_298;
  double *local_290;
  variable_if_dynamic<long,__1> local_288;
  double *local_280;
  double local_278;
  PointerType local_270;
  scalar_constant_op<double> local_268;
  PointerType local_260;
  PointerType local_258;
  scalar_constant_op<double> local_250;
  double *local_248;
  PointerType local_240;
  double *local_238;
  plainobjectbase_evaluator_data<double,_0> local_230;
  double local_228;
  scalar_constant_op<double> local_220;
  PointerType local_218;
  PointerType local_210;
  scalar_constant_op<double> local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  variable_if_dynamic<long,__1> local_1e8;
  scalar_constant_op<double> local_1e0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1c8;
  PointerType local_1b0;
  Vector3d *local_1a8;
  generic_dense_assignment_kernel<_6571596e_> local_1a0;
  PointerType local_180;
  double *local_178;
  undefined8 local_170;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  RSDoublelinCameraPoseVector *local_150;
  Matrix<double,_35,_1,_0,_35,_1> local_148;
  
  local_598 = (PointerType)r0;
  local_4c8._0_8_ = Xin;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5b0,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_4c8);
  local_4c8._0_8_ = uin;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5e0,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_4c8);
  std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::reserve(results,10);
  local_4c8._0_8_ = (PointerType)0x7;
  local_4c8._8_8_ =
       (unary_evaluator<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
        )0xb;
  local_4b8 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_550,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_4c8);
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)local_550.
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_data >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar17] = -local_5b0[(long)local_5a8 * 2 + (long)dVar17] * local_5e0.data[(long)dVar17]
      ;
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14);
  if (1 < lVar16) {
    do {
      dVar2 = (local_5b0 + (long)local_5a8 * 2 + (long)dVar14)[1];
      dVar3 = (local_5e0.data + (long)dVar14)[1];
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar14] = local_5e0.data[(long)dVar14] * -local_5b0[(long)local_5a8 * 2 + (long)dVar14]
      ;
      (local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
      (long)dVar14)[1] = dVar3 * -dVar2;
      dVar14 = (double)((long)dVar14 + 2);
    } while ((long)dVar14 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar17] = -local_5b0[(long)local_5a8 * 2 + (long)dVar17] * local_5e0.data[(long)dVar17]
      ;
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           -local_5b0[(long)local_5a8 * 2 + (long)dVar17] *
           local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14);
  if (1 < lVar16) {
    do {
      dVar2 = (local_5b0 + (long)local_5a8 * 2 + (long)dVar14)[1];
      dVar3 = (local_5e0.data + (long)local_5d8 + (long)dVar14)[1];
      pdVar13[(long)dVar14] =
           local_5e0.data[(long)local_5d8 + (long)dVar14] *
           -local_5b0[(long)local_5a8 * 2 + (long)dVar14];
      (pdVar13 + (long)dVar14)[1] = dVar3 * -dVar2;
      dVar14 = (double)((long)dVar14 + 2);
    } while ((long)dVar14 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar13[(long)dVar17] =
           -local_5b0[(long)local_5a8 * 2 + (long)dVar17] *
           local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  local_1b0 = (PointerType)
              (local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 0x10);
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 2;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           local_5b0[(long)local_5a8 + (long)dVar17] *
           local_5e0.data[(long)local_5d8 + (long)dVar17] +
           local_5b0[(long)dVar17] * local_5e0.data[(long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  lVar10 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14;
  dVar17 = dVar14;
  if (1 < lVar16) {
    do {
      dVar2 = (local_5b0 + (long)dVar17)[1];
      dVar3 = (local_5e0.data + (long)dVar17)[1];
      dVar4 = (local_5b0 + (long)local_5a8 + (long)dVar17)[1];
      dVar5 = (local_5e0.data + (long)local_5d8 + (long)dVar17)[1];
      pdVar13[(long)dVar17] =
           local_5e0.data[(long)local_5d8 + (long)dVar17] *
           local_5b0[(long)local_5a8 + (long)dVar17] +
           local_5e0.data[(long)dVar17] * local_5b0[(long)dVar17];
      (pdVar13 + (long)dVar17)[1] = dVar5 * dVar4 + dVar3 * dVar2;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar10);
  }
  if (lVar10 < local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar10 = lVar16 / 2;
    lVar11 = 0;
    do {
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [lVar10 * 2 +
       (long)dVar14 +
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       2 + lVar11] = local_5b0[(long)local_5a8 + lVar10 * 2 + (long)dVar14 + lVar11] *
                     local_5e0.data[(long)local_5d8 + lVar10 * 2 + (long)dVar14 + lVar11] +
                     local_5b0[lVar10 * 2 + (long)dVar14 + lVar11] *
                     local_5e0.data[lVar10 * 2 + (long)dVar14 + lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar16 % 2 != lVar11);
  }
  apdStack_4a0[2] = local_5b0 + (long)local_5a8 * 2;
  local_3b8 = (PointerType)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_420.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_3d0.m_value = (long)(local_5b0 + (long)local_5a8);
  local_5c8.m_data =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       3;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.48219693752374e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_4c8._8_8_ = local_5e0.data;
  local_4b0.data = local_5d8;
  local_480.m_value = (long)local_5a8;
  local_470 = local_598;
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)
       (plainobjectbase_evaluator_data<double,_0>)local_5e0.data;
  local_450.data = local_5d8;
  local_438 = local_5b0;
  local_428.m_value = (long)local_5a8;
  local_408.m_other = (double)local_598;
  local_3f8.data = local_5e0.data;
  local_3e8.data = local_5d8;
  local_3c0 = local_5a8;
  local_3a0 = local_598;
  local_390.data = local_5e0.data;
  local_380.data = local_5d8;
  local_5c8.m_cols =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_550;
  local_1a8 = vk;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = (assign_op<double,_double> *)&local_168;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  local_150 = results;
  Eigen::internal::dense_assignment_loop<$59378380$>::run
            ((generic_dense_assignment_kernel<_444fe5b5_> *)&local_1a0);
  local_4c8._8_8_ = local_5e0.data + (long)local_5d8;
  apdStack_4a0[2] = local_5b0 + (long)local_5a8 * 2;
  local_3b8 = (PointerType)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_420.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_3d0.m_value = (long)(local_5b0 + (long)local_5a8);
  local_5c8.m_data =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       4;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.97626258336499e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_4b0.data = local_5d8;
  local_480.m_value = (long)local_5a8;
  local_470 = local_598;
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)
       (plainobjectbase_evaluator_data<double,_0>)local_5e0.data;
  local_450.data = local_5d8;
  local_438 = local_5b0;
  local_428.m_value = (long)local_5a8;
  local_408.m_other = (double)local_598;
  local_3f8.data = local_5e0.data;
  local_3e8.data = local_5d8;
  local_3c0 = local_5a8;
  local_3a0 = local_598;
  local_390.data = local_5e0.data;
  local_380.data = local_5d8;
  local_5c8.m_cols =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_550;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = (assign_op<double,_double> *)&local_168;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$59378380$>::run
            ((generic_dense_assignment_kernel<_444fe5b5_> *)&local_1a0);
  local_428.m_value = (long)(local_5b0 + (long)local_5a8);
  local_410 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_3c0 = local_5b0 + (long)local_5a8 * 2;
  local_258 = (PointerType)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_3a8 = (PointerType)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  local_5c8.m_data =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       5;
  local_360 = local_5e0.data + (long)local_5d8;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.47032822920623e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_4b0.data = local_5e0.data;
  apdStack_4a0[0] = local_5d8;
  local_480.m_value = (long)local_5b0;
  local_470 = local_5a8;
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)
       (plainobjectbase_evaluator_data<double,_0>)local_598;
  local_450.data = local_5e0.data;
  local_440 = local_5d8;
  local_418 = local_5a8;
  local_3f8.data = local_598;
  local_3e8.data = local_5e0.data;
  local_3d8 = local_5d8;
  local_3b0.m_other = (double)local_5a8;
  local_390.data = local_598;
  local_380.data = local_5e0.data;
  local_370 = local_5d8;
  local_350 = local_5d8;
  local_320 = local_5a8;
  local_310.m_other = (double)local_598;
  local_300.data = local_5e0.data;
  local_2f0.m_value = (long)local_5d8;
  local_2d8 = local_5b0;
  local_2c8.m_other = (double)local_5a8;
  local_2a8.m_value = (long)local_598;
  local_298.data = local_5e0.data;
  local_288.m_value = (long)local_5d8;
  local_260 = local_5a8;
  local_240 = local_598;
  local_230.data = local_5e0.data;
  local_220.m_other = (double)local_5d8;
  local_5c8.m_cols =
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_550;
  local_330 = (PointerType)local_428.m_value;
  local_2c0 = local_410;
  local_270 = local_3c0;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = (assign_op<double,_double> *)&local_168;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$a449f637$>::run
            ((generic_dense_assignment_kernel<_77ea032a_> *)&local_1a0);
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 6;
  local_4b0.data = (double *)&local_5e0;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] = -local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14);
  if (1 < lVar16) {
    do {
      dVar2 = (local_5e0.data + (long)local_5d8 + (long)dVar14)[1];
      pdVar13[(long)dVar14] = -local_5e0.data[(long)local_5d8 + (long)dVar14];
      (pdVar13 + (long)dVar14)[1] = -dVar2;
      dVar14 = (double)((long)dVar14 + 2);
    } while ((long)dVar14 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar13[(long)dVar17] = -local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  local_4c8._0_8_ = local_5e0.data;
  local_4c8._8_8_ = local_5d8;
  local_4a8 = (PointerType)0x0;
  apdStack_4a0[0] = (double *)0x0;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)(local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 7);
  apdStack_4a0[1] = local_5d8;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 3.45845952088873e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_550;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::operator=
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             &local_538,
             (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             local_4c8);
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           ((double)local_598 - local_5e0.data[(long)dVar17]) *
           local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  lVar10 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14;
  dVar17 = dVar14;
  if (1 < lVar16) {
    do {
      dVar2 = (local_5e0.data + (long)local_5d8 + (long)dVar17)[1];
      dVar3 = (local_5e0.data + (long)dVar17)[1];
      pdVar13[(long)dVar17] =
           ((double)local_598 - local_5e0.data[(long)dVar17]) *
           local_5e0.data[(long)local_5d8 + (long)dVar17];
      (pdVar13 + (long)dVar17)[1] = ((double)local_598 - dVar3) * dVar2;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar10);
  }
  if (lVar10 < local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar10 = lVar16 % 2;
    pdVar13 = local_5e0.data + (long)dVar14 + (lVar16 / 2) * 2;
    pdVar8 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + (long)dVar14 +
                      (lVar16 / 2) * 2 +
                      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * 8;
    do {
      *pdVar8 = ((double)local_598 - *pdVar13) * pdVar13[(long)local_5d8];
      pdVar13 = pdVar13 + 1;
      pdVar8 = pdVar8 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 9;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           -local_5e0.data[(long)dVar17] * ((double)local_598 - local_5e0.data[(long)dVar17]);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14);
  if (1 < lVar16) {
    do {
      dVar2 = local_5e0.data[(long)dVar14];
      dVar3 = (local_5e0.data + (long)dVar14)[1];
      pdVar13[(long)dVar14] = -dVar2 * ((double)local_598 - dVar2);
      (pdVar13 + (long)dVar14)[1] = -dVar3 * ((double)local_598 - dVar3);
      dVar14 = (double)((long)dVar14 + 2);
    } while ((long)dVar14 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar13[(long)dVar17] =
           -local_5e0.data[(long)dVar17] * ((double)local_598 - local_5e0.data[(long)dVar17]);
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  pdVar13 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data + local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 10;
  dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1),
     local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar14)) {
    dVar14 = (double)local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  local_1b0 = local_5a8;
  lVar16 = local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           local_5b0[(long)local_5a8 + (long)dVar17] * local_5e0.data[(long)dVar17] -
           local_5b0[(long)dVar17] * local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  lVar10 = (long)dVar14 + (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU);
  dVar17 = dVar14;
  if (1 < lVar16) {
    do {
      dVar2 = (local_5b0 + (long)local_5a8 + (long)dVar17)[1];
      dVar3 = (local_5e0.data + (long)dVar17)[1];
      dVar4 = (local_5b0 + (long)dVar17)[1];
      dVar5 = (local_5e0.data + (long)local_5d8 + (long)dVar17)[1];
      pdVar13[(long)dVar17] =
           local_5e0.data[(long)dVar17] * local_5b0[(long)local_5a8 + (long)dVar17] -
           local_5e0.data[(long)local_5d8 + (long)dVar17] * local_5b0[(long)dVar17];
      (pdVar13 + (long)dVar17)[1] = dVar3 * dVar2 - dVar5 * dVar4;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar10);
  }
  if (lVar10 < local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar11 = lVar16 / 2;
    lVar10 = 0;
    do {
      local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar14 +
       lVar11 * 2 +
       local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       10 + lVar10] =
           local_5b0[(long)local_5a8 + (long)dVar14 + lVar11 * 2 + lVar10] *
           local_5e0.data[(long)dVar14 + lVar11 * 2 + lVar10] -
           local_5b0[(long)dVar14 + lVar11 * 2 + lVar10] *
           local_5e0.data[(long)local_5d8 + (long)dVar14 + lVar11 * 2 + lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar16 % 2 != lVar10);
  }
  Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_4c8,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_550);
  pVVar7 = local_1a8;
  Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::kernel_retval_base
            ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_538,(DecompositionType *)local_4c8);
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  dVar14 = *(double *)
            ((long)local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] + 0x10);
  if ((local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[2] != 0.0 && dVar14 != 0.0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816((long)local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2]),0) < (long)dVar14)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::ios::widen;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_168,
             (long)local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] * (long)dVar14,(Index)dVar14,
             (Index)local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2]);
  Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_538,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_168);
  free((void *)local_480.m_value);
  free(apdStack_4a0[2]);
  free(apdStack_4a0[0]);
  free(local_4b0.data);
  free((void *)local_4c8._0_8_);
  local_568.m_data = (double *)0x0;
  local_568.m_rows = 0;
  local_568.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_568,0x28,10,4);
  pdVar13 = local_5d8;
  pVar6.data = local_5e0.data;
  lVar16 = 0;
  do {
    *(double *)((long)local_568.m_data + lVar16) =
         *(double *)((long)local_168.m_data + lVar16) -
         (*(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 0x18) *
         local_168.m_data[10]) / local_168.m_data[local_168.m_rows * 3 + 10];
    *(double *)((long)local_568.m_data + lVar16 + local_568.m_rows * 8) =
         *(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 8) -
         (*(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 0x18) *
         local_168.m_data[local_168.m_rows + 10]) / local_168.m_data[local_168.m_rows * 3 + 10];
    *(double *)((long)local_568.m_data + lVar16 + local_568.m_rows * 0x10) =
         *(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 0x10) -
         (*(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 0x18) *
         local_168.m_data[local_168.m_rows * 2 + 10]) / local_168.m_data[local_168.m_rows * 3 + 10];
    *(double *)((long)local_568.m_data + lVar16 + local_568.m_rows * 0x18) =
         *(double *)((long)local_168.m_data + lVar16 + local_168.m_rows * 0x18) /
         local_168.m_data[local_168.m_rows * 3 + 10];
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x50);
  local_1c8.m_storage.m_data = (double *)0x0;
  local_1c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_1c8,(Index)local_5d8,1);
  pdVar8 = pdVar13;
  if ((double *)local_1c8.m_storage.m_rows != pdVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_1c8,(Index)pdVar13,1);
    pdVar8 = (double *)local_1c8.m_storage.m_rows;
  }
  if (0 < (long)pdVar8) {
    pdVar12 = (double *)0x0;
    do {
      dVar14 = pVar6.data[(long)pdVar12];
      dVar17 = pVar6.data[(long)pdVar13 + (long)pdVar12];
      local_1c8.m_storage.m_data[(long)pdVar12] = dVar17 * dVar17 + dVar14 * dVar14;
      pdVar12 = (double *)((long)pdVar12 + 1);
    } while (pdVar8 != pdVar12);
  }
  local_588.m_data = (double *)0x0;
  local_588.m_rows = 0;
  local_588.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_588,0x62,7,0xe);
  local_4b8 = (double)(local_5e0.data + (long)local_5d8);
  apdStack_4a0[3] = local_5b0 + (long)local_5a8;
  local_458 = (PointerType)local_568.m_data[3];
  local_378.m_value = (long)local_568.m_data[4];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_400 = (PointerType)((double)local_378.m_value * dVar14);
  local_418 = (PointerType)*local_568.m_data;
  local_390.data = (double *)local_568.m_data[1];
  local_330 = (PointerType)(dVar14 * (double)local_458);
  local_2e8 = local_5b0 + (long)local_5a8 * 2;
  local_2c0 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_458;
  local_278 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_378.m_value;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_data;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4a8 = local_5d8;
  local_478 = local_5a8;
  local_440 = local_598;
  local_430 = local_5e0.data;
  local_420.m_other = (double)local_5d8;
  local_3e8.data = local_598;
  local_3d8 = local_5e0.data;
  local_3c8.m_other = (double)local_5d8;
  local_3b8 = local_5b0;
  local_3a8 = local_5a8;
  local_360 = local_598;
  local_350 = local_5e0.data;
  local_340.m_other = (double)local_5d8;
  local_318 = local_598;
  local_308 = local_5e0.data;
  local_2f8 = local_5d8;
  local_2d8 = local_5a8;
  local_2a8.m_value = (long)local_598;
  local_298.data = local_5e0.data;
  local_288.m_value = (long)local_5d8;
  local_260 = local_598;
  local_250.m_other = (double)local_5e0.data;
  local_240 = local_5d8;
  local_5c8.m_data = local_588.m_data;
  local_5c8.m_cols = local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_1a0);
  local_460.m_d.data = (plainobjectbase_evaluator_data<double,_0>)local_568.m_data[5];
  local_340.m_other = *local_568.m_data;
  local_420.m_other = local_568.m_data[2];
  local_328.m_other = local_568.m_data[3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_408.m_other = local_328.m_other * dVar14;
  local_3c8.m_other = local_568.m_data[7];
  local_3b0.m_other = local_568.m_data[9];
  local_368 = local_5b0 + (long)local_5a8 * 2;
  local_2e0.m_other = dVar14 * (double)local_460.m_d.data;
  local_298.data = local_5b0 + (long)local_5a8;
  local_270 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_328.m_other);
  local_228 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * (double)local_460.m_d.data;
  local_5c8.m_data = local_588.m_data + local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.94065645841247e-324;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4c8._8_8_ = local_1c8.m_storage.m_data;
  apdStack_4a0[2] = local_5b0;
  local_480.m_value = (long)local_5a8;
  local_448.m_other = (double)local_598;
  local_438 = local_5e0.data;
  local_428.m_value = (long)local_5d8;
  local_3f0.m_other = (double)local_598;
  local_3e0 = local_5e0.data;
  local_3d0.m_value = (long)local_5d8;
  local_398.m_other = (double)local_598;
  local_388 = local_5e0.data;
  local_378.m_value = (long)local_5d8;
  local_358.m_value = (long)local_5a8;
  local_310.m_other = (double)local_598;
  local_300.data = local_5e0.data;
  local_2f0.m_value = (long)local_5d8;
  local_2c8.m_other = (double)local_598;
  local_2b8 = local_5e0.data;
  local_2a8.m_value = (long)local_5d8;
  local_288.m_value = (long)local_5a8;
  local_258 = local_598;
  local_248 = local_5e0.data;
  local_238 = local_5d8;
  local_210 = local_598;
  local_200 = local_5e0.data;
  local_1f0 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$5904554a$>::run
            ((generic_dense_assignment_kernel<_db2fe82b_> *)&local_1a0);
  local_470 = (PointerType)local_568.m_data[5];
  local_350 = (double *)*local_568.m_data;
  local_430 = (double *)local_568.m_data[2];
  local_338 = local_568.m_data[3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_418 = (PointerType)(local_338 * dVar14);
  local_3d8 = (double *)local_568.m_data[7];
  local_3c0 = (PointerType)local_568.m_data[9];
  local_378.m_value = (long)(local_5b0 + (long)local_5a8 * 2);
  local_2f0.m_value = (long)(dVar14 * (double)local_470);
  local_2a8.m_value = (long)(local_5b0 + (long)local_5a8);
  local_280 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_338);
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 2;
  local_238 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2] * (double)local_470);
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 9.88131291682493e-324;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  apdStack_4a0[0] = local_5b0;
  apdStack_4a0[2] = local_5a8;
  local_458 = local_598;
  local_448.m_other = (double)local_5e0.data;
  local_438 = local_5d8;
  local_400 = local_598;
  local_3f0.m_other = (double)local_5e0.data;
  local_3e0 = local_5d8;
  local_3a8 = local_598;
  local_398.m_other = (double)local_5e0.data;
  local_388 = local_5d8;
  local_368 = local_5a8;
  local_320 = local_598;
  local_310.m_other = (double)local_5e0.data;
  local_300.data = local_5d8;
  local_2d8 = local_598;
  local_2c8.m_other = (double)local_5e0.data;
  local_2b8 = local_5d8;
  local_298.data = local_5a8;
  local_268.m_other = (double)local_598;
  local_258 = local_5e0.data;
  local_248 = local_5d8;
  local_220.m_other = (double)local_598;
  local_210 = local_5e0.data;
  local_200 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_1a0);
  local_4b8 = (double)(local_5e0.data + (long)local_5d8);
  apdStack_4a0[3] = local_5b0 + (long)local_5a8;
  local_458 = (PointerType)local_568.m_data[local_568.m_rows + 3];
  local_378.m_value = (long)local_568.m_data[local_568.m_rows + 4];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_400 = (PointerType)((double)local_378.m_value * dVar14);
  local_418 = (PointerType)local_568.m_data[local_568.m_rows];
  local_390.data = (double *)local_568.m_data[local_568.m_rows + 1];
  local_330 = (PointerType)(dVar14 * (double)local_458);
  local_2e8 = local_5b0 + (long)local_5a8 * 2;
  local_2c0 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_458;
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 3;
  local_278 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_378.m_value;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.48219693752374e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4a8 = local_5d8;
  local_478 = local_5a8;
  local_440 = local_598;
  local_430 = local_5e0.data;
  local_420.m_other = (double)local_5d8;
  local_3e8.data = local_598;
  local_3d8 = local_5e0.data;
  local_3c8.m_other = (double)local_5d8;
  local_3b8 = local_5b0;
  local_3a8 = local_5a8;
  local_360 = local_598;
  local_350 = local_5e0.data;
  local_340.m_other = (double)local_5d8;
  local_318 = local_598;
  local_308 = local_5e0.data;
  local_2f8 = local_5d8;
  local_2d8 = local_5a8;
  local_2a8.m_value = (long)local_598;
  local_298.data = local_5e0.data;
  local_288.m_value = (long)local_5d8;
  local_260 = local_598;
  local_250.m_other = (double)local_5e0.data;
  local_240 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_1a0);
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)local_568.m_data[local_568.m_rows + 5];
  local_340.m_other = local_568.m_data[local_568.m_rows];
  local_420.m_other = local_568.m_data[local_568.m_rows + 2];
  local_328.m_other = local_568.m_data[local_568.m_rows + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_408.m_other = local_328.m_other * dVar14;
  local_3c8.m_other = local_568.m_data[local_568.m_rows + 7];
  local_3b0.m_other = local_568.m_data[local_568.m_rows + 9];
  local_368 = local_5b0 + (long)local_5a8 * 2;
  local_2e0.m_other = dVar14 * (double)local_460.m_d.data;
  local_298.data = local_5b0 + (long)local_5a8;
  local_270 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_328.m_other);
  local_228 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * (double)local_460.m_d.data;
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 4;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.97626258336499e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4c8._8_8_ = local_1c8.m_storage.m_data;
  apdStack_4a0[2] = local_5b0;
  local_480.m_value = (long)local_5a8;
  local_448.m_other = (double)local_598;
  local_438 = local_5e0.data;
  local_428.m_value = (long)local_5d8;
  local_3f0.m_other = (double)local_598;
  local_3e0 = local_5e0.data;
  local_3d0.m_value = (long)local_5d8;
  local_398.m_other = (double)local_598;
  local_388 = local_5e0.data;
  local_378.m_value = (long)local_5d8;
  local_358.m_value = (long)local_5a8;
  local_310.m_other = (double)local_598;
  local_300.data = local_5e0.data;
  local_2f0.m_value = (long)local_5d8;
  local_2c8.m_other = (double)local_598;
  local_2b8 = local_5e0.data;
  local_2a8.m_value = (long)local_5d8;
  local_288.m_value = (long)local_5a8;
  local_258 = local_598;
  local_248 = local_5e0.data;
  local_238 = local_5d8;
  local_210 = local_598;
  local_200 = local_5e0.data;
  local_1f0 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$5904554a$>::run
            ((generic_dense_assignment_kernel<_db2fe82b_> *)&local_1a0);
  local_470 = (PointerType)local_568.m_data[local_568.m_rows + 5];
  local_350 = (double *)local_568.m_data[local_568.m_rows];
  local_430 = (double *)local_568.m_data[local_568.m_rows + 2];
  local_338 = local_568.m_data[local_568.m_rows + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_418 = (PointerType)(local_338 * dVar14);
  local_3d8 = (double *)local_568.m_data[local_568.m_rows + 7];
  local_3c0 = (PointerType)local_568.m_data[local_568.m_rows + 9];
  local_378.m_value = (long)(local_5b0 + (long)local_5a8 * 2);
  local_2f0.m_value = (long)(dVar14 * (double)local_470);
  local_2a8.m_value = (long)(local_5b0 + (long)local_5a8);
  local_280 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_338);
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 7;
  local_238 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2] * (double)local_470);
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 3.45845952088873e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  apdStack_4a0[0] = local_5b0;
  apdStack_4a0[2] = local_5a8;
  local_458 = local_598;
  local_448.m_other = (double)local_5e0.data;
  local_438 = local_5d8;
  local_400 = local_598;
  local_3f0.m_other = (double)local_5e0.data;
  local_3e0 = local_5d8;
  local_3a8 = local_598;
  local_398.m_other = (double)local_5e0.data;
  local_388 = local_5d8;
  local_368 = local_5a8;
  local_320 = local_598;
  local_310.m_other = (double)local_5e0.data;
  local_300.data = local_5d8;
  local_2d8 = local_598;
  local_2c8.m_other = (double)local_5e0.data;
  local_2b8 = local_5d8;
  local_298.data = local_5a8;
  local_268.m_other = (double)local_598;
  local_258 = local_5e0.data;
  local_248 = local_5d8;
  local_220.m_other = (double)local_598;
  local_210 = local_5e0.data;
  local_200 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_1a0);
  local_4b8 = (double)(local_5e0.data + (long)local_5d8);
  apdStack_4a0[3] = local_5b0 + (long)local_5a8;
  local_458 = (PointerType)local_568.m_data[local_568.m_rows * 2 + 3];
  local_378.m_value = (long)local_568.m_data[local_568.m_rows * 2 + 4];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_400 = (PointerType)((double)local_378.m_value * dVar14);
  local_418 = (PointerType)local_568.m_data[local_568.m_rows * 2];
  local_390.data = (double *)local_568.m_data[local_568.m_rows * 2 + 1];
  local_330 = (PointerType)(dVar14 * (double)local_458);
  local_2e8 = local_5b0 + (long)local_5a8 * 2;
  local_2c0 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_458;
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 8;
  local_278 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_378.m_value;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 3.95252516672997e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4a8 = local_5d8;
  local_478 = local_5a8;
  local_440 = local_598;
  local_430 = local_5e0.data;
  local_420.m_other = (double)local_5d8;
  local_3e8.data = local_598;
  local_3d8 = local_5e0.data;
  local_3c8.m_other = (double)local_5d8;
  local_3b8 = local_5b0;
  local_3a8 = local_5a8;
  local_360 = local_598;
  local_350 = local_5e0.data;
  local_340.m_other = (double)local_5d8;
  local_318 = local_598;
  local_308 = local_5e0.data;
  local_2f8 = local_5d8;
  local_2d8 = local_5a8;
  local_2a8.m_value = (long)local_598;
  local_298.data = local_5e0.data;
  local_288.m_value = (long)local_5d8;
  local_260 = local_598;
  local_250.m_other = (double)local_5e0.data;
  local_240 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_1a0);
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)local_568.m_data[local_568.m_rows * 2 + 5];
  local_340.m_other = local_568.m_data[local_568.m_rows * 2];
  local_420.m_other = local_568.m_data[local_568.m_rows * 2 + 2];
  local_328.m_other = local_568.m_data[local_568.m_rows * 2 + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_408.m_other = local_328.m_other * dVar14;
  local_3c8.m_other = local_568.m_data[local_568.m_rows * 2 + 7];
  local_3b0.m_other = local_568.m_data[local_568.m_rows * 2 + 9];
  local_368 = local_5b0 + (long)local_5a8 * 2;
  local_2e0.m_other = dVar14 * (double)local_460.m_d.data;
  local_298.data = local_5b0 + (long)local_5a8;
  local_270 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_328.m_other);
  local_228 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * (double)local_460.m_d.data;
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 9;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.44659081257122e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4c8._8_8_ = local_1c8.m_storage.m_data;
  apdStack_4a0[2] = local_5b0;
  local_480.m_value = (long)local_5a8;
  local_448.m_other = (double)local_598;
  local_438 = local_5e0.data;
  local_428.m_value = (long)local_5d8;
  local_3f0.m_other = (double)local_598;
  local_3e0 = local_5e0.data;
  local_3d0.m_value = (long)local_5d8;
  local_398.m_other = (double)local_598;
  local_388 = local_5e0.data;
  local_378.m_value = (long)local_5d8;
  local_358.m_value = (long)local_5a8;
  local_310.m_other = (double)local_598;
  local_300.data = local_5e0.data;
  local_2f0.m_value = (long)local_5d8;
  local_2c8.m_other = (double)local_598;
  local_2b8 = local_5e0.data;
  local_2a8.m_value = (long)local_5d8;
  local_288.m_value = (long)local_5a8;
  local_258 = local_598;
  local_248 = local_5e0.data;
  local_238 = local_5d8;
  local_210 = local_598;
  local_200 = local_5e0.data;
  local_1f0 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$5904554a$>::run
            ((generic_dense_assignment_kernel<_db2fe82b_> *)&local_1a0);
  local_470 = (PointerType)local_568.m_data[local_568.m_rows * 2 + 5];
  local_350 = (double *)local_568.m_data[local_568.m_rows * 2];
  local_430 = (double *)local_568.m_data[local_568.m_rows * 2 + 2];
  local_338 = local_568.m_data[local_568.m_rows * 2 + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_418 = (PointerType)(local_338 * dVar14);
  local_3d8 = (double *)local_568.m_data[local_568.m_rows * 2 + 7];
  local_3c0 = (PointerType)local_568.m_data[local_568.m_rows * 2 + 9];
  local_378.m_value = (long)(local_5b0 + (long)local_5a8 * 2);
  local_2f0.m_value = (long)(dVar14 * (double)local_470);
  local_2a8.m_value = (long)(local_5b0 + (long)local_5a8);
  local_280 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_338);
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 10;
  local_238 = (double *)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2] * (double)local_470);
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.94065645841247e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  apdStack_4a0[0] = local_5b0;
  apdStack_4a0[2] = local_5a8;
  local_458 = local_598;
  local_448.m_other = (double)local_5e0.data;
  local_438 = local_5d8;
  local_400 = local_598;
  local_3f0.m_other = (double)local_5e0.data;
  local_3e0 = local_5d8;
  local_3a8 = local_598;
  local_398.m_other = (double)local_5e0.data;
  local_388 = local_5d8;
  local_368 = local_5a8;
  local_320 = local_598;
  local_310.m_other = (double)local_5e0.data;
  local_300.data = local_5d8;
  local_2d8 = local_598;
  local_2c8.m_other = (double)local_5e0.data;
  local_2b8 = local_5d8;
  local_298.data = local_5a8;
  local_268.m_other = (double)local_598;
  local_258 = local_5e0.data;
  local_248 = local_5d8;
  local_220.m_other = (double)local_598;
  local_210 = local_5e0.data;
  local_200 = local_5d8;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_1a0);
  pVVar7 = local_1a8;
  pdVar13 = local_588.m_data + local_588.m_rows * 5;
  dVar14 = (double)local_588.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1), local_588.m_rows <= (long)dVar14))
  {
    dVar14 = (double)local_588.m_rows;
  }
  lVar16 = local_588.m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] = local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14);
  if (1 < lVar16) {
    do {
      dVar2 = (local_5e0.data + (long)local_5d8 + (long)dVar14)[1];
      pdVar13[(long)dVar14] = local_5e0.data[(long)local_5d8 + (long)dVar14];
      (pdVar13 + (long)dVar14)[1] = dVar2;
      dVar14 = (double)((long)dVar14 + 2);
    } while ((long)dVar14 < (long)dVar17);
  }
  if ((long)dVar17 < local_588.m_rows) {
    do {
      pdVar13[(long)dVar17] = local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_588.m_rows != dVar17);
  }
  pdVar13 = local_588.m_data + local_588.m_rows * 6;
  dVar14 = (double)local_588.m_rows;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (dVar14 = (double)(ulong)((uint)((ulong)pdVar13 >> 3) & 1), local_588.m_rows <= (long)dVar14))
  {
    dVar14 = (double)local_588.m_rows;
  }
  lVar16 = local_588.m_rows - (long)dVar14;
  if (0 < (long)dVar14) {
    dVar17 = 0.0;
    do {
      pdVar13[(long)dVar17] =
           ((double)local_598 - local_5e0.data[(long)dVar17]) *
           -local_5e0.data[(long)local_5d8 + (long)dVar17];
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar14 != dVar17);
  }
  lVar10 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar14;
  dVar17 = dVar14;
  if (1 < lVar16) {
    do {
      dVar2 = (local_5e0.data + (long)local_5d8 + (long)dVar17)[1];
      dVar3 = (local_5e0.data + (long)dVar17)[1];
      pdVar13[(long)dVar17] =
           ((double)local_598 - local_5e0.data[(long)dVar17]) *
           -local_5e0.data[(long)local_5d8 + (long)dVar17];
      (pdVar13 + (long)dVar17)[1] = ((double)local_598 - dVar3) * -dVar2;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar10);
  }
  if (lVar10 < local_588.m_rows) {
    lVar10 = lVar16 % 2;
    pdVar13 = local_5e0.data + (long)dVar14 + (lVar16 / 2) * 2;
    pdVar8 = local_588.m_data + (long)dVar14 + (lVar16 / 2) * 2 + local_588.m_rows * 6;
    do {
      *pdVar8 = ((double)local_598 - *pdVar13) * -pdVar13[(long)local_5d8];
      pdVar13 = pdVar13 + 1;
      pdVar8 = pdVar8 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  local_4b8 = (double)(local_5e0.data + (long)local_5d8);
  apdStack_4a0[3] = local_5b0 + (long)local_5a8;
  local_458 = (PointerType)local_568.m_data[local_568.m_rows * 3 + 3];
  local_378.m_value = (long)local_568.m_data[local_568.m_rows * 3 + 4];
  dVar14 = (local_1a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2];
  local_400 = (PointerType)((double)local_378.m_value * dVar14);
  local_418 = (PointerType)local_568.m_data[local_568.m_rows * 3];
  local_390.data = (double *)local_568.m_data[local_568.m_rows * 3 + 1];
  local_330 = (PointerType)(dVar14 * (double)local_458);
  local_2e8 = local_5b0 + (long)local_5a8 * 2;
  local_2b8 = (double *)
              ((local_1a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * (double)local_458);
  local_270 = (PointerType)
              ((local_1a8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1] * (double)local_378.m_value);
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 0xb;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 5.43472210425371e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4a8 = local_5d8;
  local_478 = local_5a8;
  local_440 = local_598;
  local_430 = local_5e0.data;
  local_420.m_other = (double)local_5d8;
  local_3e8.data = local_598;
  local_3d8 = local_5e0.data;
  local_3c8.m_other = (double)local_5d8;
  local_3b8 = local_5b0;
  local_3a8 = local_5a8;
  local_360 = local_598;
  local_350 = local_5e0.data;
  local_340.m_other = (double)local_5d8;
  local_318 = local_598;
  local_308 = local_5e0.data;
  local_2f8 = local_5d8;
  local_2d8 = local_5a8;
  local_2a0 = local_598;
  local_290 = local_5e0.data;
  local_280 = local_5d8;
  local_258 = local_598;
  local_248 = local_5e0.data;
  local_238 = local_5d8;
  local_230.data = (double *)0x3ff0000000000000;
  local_5c8.m_cols = local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_functor = &local_5e1;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$61c3f364$>::run
            ((generic_dense_assignment_kernel<_e2bb5851_> *)&local_1a0);
  local_460.m_d.data =
       (plainobjectbase_evaluator_data<double,_0>)local_568.m_data[local_568.m_rows * 3 + 5];
  local_340.m_other = local_568.m_data[local_568.m_rows * 3];
  local_420.m_other = local_568.m_data[local_568.m_rows * 3 + 2];
  local_328.m_other = local_568.m_data[local_568.m_rows * 3 + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_408.m_other = local_328.m_other * dVar14;
  local_3c8.m_other = local_568.m_data[local_568.m_rows * 3 + 7];
  local_3b0.m_other = local_568.m_data[local_568.m_rows * 3 + 9];
  local_368 = local_5b0 + (long)local_5a8 * 2;
  local_2e0.m_other = dVar14 * (double)local_460.m_d.data;
  local_298.data = local_5b0 + (long)local_5a8;
  local_268.m_other =
       (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0] * local_328.m_other;
  local_220.m_other =
       (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [2] * (double)local_460.m_d.data;
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 0xc;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 5.92878775009496e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_4c8._8_8_ = local_1c8.m_storage.m_data;
  apdStack_4a0[2] = local_5b0;
  local_480.m_value = (long)local_5a8;
  local_448.m_other = (double)local_598;
  local_438 = local_5e0.data;
  local_428.m_value = (long)local_5d8;
  local_3f0.m_other = (double)local_598;
  local_3e0 = local_5e0.data;
  local_3d0.m_value = (long)local_5d8;
  local_398.m_other = (double)local_598;
  local_388 = local_5e0.data;
  local_378.m_value = (long)local_5d8;
  local_358.m_value = (long)local_5a8;
  local_310.m_other = (double)local_598;
  local_300.data = local_5e0.data;
  local_2f0.m_value = (long)local_5d8;
  local_2c8.m_other = (double)local_598;
  local_2b8 = local_5e0.data;
  local_2a8.m_value = (long)local_5d8;
  local_288.m_value = (long)local_5a8;
  local_250.m_other = (double)local_598;
  local_240 = local_5e0.data;
  local_230.data = local_5d8;
  local_208.m_other = (double)local_598;
  local_1f8 = local_5e0.data;
  local_1e8.m_value = (long)local_5d8;
  local_1e0.m_other = 1.0;
  local_5c8.m_cols = local_588.m_rows;
  local_1a0.m_functor = &local_5e1;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$ddd941f3$>::run(&local_1a0);
  local_470 = (PointerType)local_568.m_data[local_568.m_rows * 3 + 5];
  local_350 = (double *)local_568.m_data[local_568.m_rows * 3];
  local_430 = (double *)local_568.m_data[local_568.m_rows * 3 + 2];
  local_338 = local_568.m_data[local_568.m_rows * 3 + 3];
  dVar14 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_418 = (PointerType)(local_338 * dVar14);
  local_3d8 = (double *)local_568.m_data[local_568.m_rows * 3 + 7];
  local_3c0 = (PointerType)local_568.m_data[local_568.m_rows * 3 + 9];
  local_378.m_value = (long)(local_5b0 + (long)local_5a8 * 2);
  local_2f0.m_value = (long)(dVar14 * (double)local_470);
  local_2a8.m_value = (long)(local_5b0 + (long)local_5a8);
  local_278 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * local_338;
  local_230.data =
       (double *)
       ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] * (double)local_470);
  local_5c8.m_data = local_588.m_data + local_588.m_rows * 0xd;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 6.42285339593621e-323;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  apdStack_4a0[0] = local_5b0;
  apdStack_4a0[2] = local_5a8;
  local_458 = local_598;
  local_448.m_other = (double)local_5e0.data;
  local_438 = local_5d8;
  local_400 = local_598;
  local_3f0.m_other = (double)local_5e0.data;
  local_3e0 = local_5d8;
  local_3a8 = local_598;
  local_398.m_other = (double)local_5e0.data;
  local_388 = local_5d8;
  local_368 = local_5a8;
  local_320 = local_598;
  local_310.m_other = (double)local_5e0.data;
  local_300.data = local_5d8;
  local_2d8 = local_598;
  local_2c8.m_other = (double)local_5e0.data;
  local_2b8 = local_5d8;
  local_298.data = local_5a8;
  local_260 = local_598;
  local_250.m_other = (double)local_5e0.data;
  local_240 = local_5d8;
  local_218 = local_598;
  local_208.m_other = (double)local_5e0.data;
  local_1f8 = local_5d8;
  local_1f0 = (double *)0x3ff0000000000000;
  local_5c8.m_cols = local_588.m_rows;
  local_1a0.m_functor = &local_5e1;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_5c8.m_data;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  local_1a0.m_dst = (DstEvaluatorType *)&local_5c8;
  local_1a0.m_src = (SrcEvaluatorType *)local_4c8;
  local_1a0.m_dstExpr = (DstXprType *)&local_538;
  Eigen::internal::dense_assignment_loop<$64b0bb91$>::run
            ((generic_dense_assignment_kernel<_aeebd7c4_> *)&local_1a0);
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_data;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_588.m_rows;
  local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 3.45845952088873e-323;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_588.m_rows;
  local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_588;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>::lu
            ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4c8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             &local_538);
  local_5c8.m_data = (double *)0x0;
  local_5c8.m_rows = 0;
  local_5c8.m_cols = 0;
  local_1a0.m_dst = (DstEvaluatorType *)local_4c8;
  local_1a0.m_src = (SrcEvaluatorType *)&local_588;
  if ((local_588.m_cols != 0 && (double *)local_4b8 != (double *)0x0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_588.m_cols),0) <
      (long)local_4b8)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::ios::widen;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_5c8,local_588.m_cols * (long)local_4b8,(Index)local_4b8,local_588.m_cols);
  this = local_150;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_5c8,(SrcXprType *)&local_1a0,&local_5e1);
  free(apdStack_4a0[0]);
  free(local_4b0.data);
  free((void *)local_4c8._0_8_);
  lVar16 = (local_5c8.m_cols + -7) * local_5c8.m_rows;
  pdVar13 = local_5c8.m_data + lVar16;
  lVar10 = 0;
  do {
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar10] = *pdVar13;
    lVar10 = lVar10 + 1;
    pdVar13 = pdVar13 + local_5c8.m_rows;
  } while (lVar10 != 7);
  pdVar13 = local_5c8.m_data + lVar16 + 1;
  lVar10 = 7;
  do {
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar10] = *pdVar13;
    lVar10 = lVar10 + 1;
    pdVar13 = pdVar13 + local_5c8.m_rows;
  } while (lVar10 != 0xe);
  pdVar13 = local_5c8.m_data + lVar16 + 2;
  lVar10 = 0xe;
  do {
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar10] = *pdVar13;
    lVar10 = lVar10 + 1;
    pdVar13 = pdVar13 + local_5c8.m_rows;
  } while (lVar10 != 0x15);
  pdVar13 = local_5c8.m_data + lVar16 + 3;
  lVar10 = 0x15;
  do {
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar10] = *pdVar13;
    lVar10 = lVar10 + 1;
    pdVar13 = pdVar13 + local_5c8.m_rows;
  } while (lVar10 != 0x1c);
  pdVar13 = local_5c8.m_data + lVar16 + 4;
  lVar16 = 0x1c;
  do {
    local_148.super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar16] = *pdVar13;
    lVar16 = lVar16 + 1;
    pdVar13 = pdVar13 + local_5c8.m_rows;
  } while (lVar16 != 0x23);
  memset((Matrix<std::complex<double>,_4,_10,_0,_4,_10> *)local_4c8,0,0x280);
  solver_R7Pfr(&local_148,(Matrix<std::complex<double>,_4,_10,_0,_4,_10> *)local_4c8);
  lVar16 = 0;
  do {
    pdVar1 = (&local_4a8)[lVar16 * 8];
    if (((!NAN((double)pdVar1)) && (1e-06 < ABS((double)pdVar1))) &&
       (ABS((double)apdStack_4a0[lVar16 * 8]) < 1e-10)) {
      local_1a0.m_dst = *(DstEvaluatorType **)(local_4c8 + lVar16 * 0x40);
      local_1a0.m_dstExpr = (DstXprType *)(&local_4b8)[lVar16 * 8];
      local_538.rd = (double)apdStack_4a0[lVar16 * 8U + 1];
      local_1a0.m_src = (SrcEvaluatorType *)((double)local_1a0.m_dstExpr * (double)pdVar1);
      local_1a0.m_functor =
           (assign_op<double,_double> *)(local_538.rd * (double)local_1a0.m_dstExpr);
      local_180 = pdVar1;
      local_178 = (double *)local_538.rd;
      local_170 = 0x3ff0000000000000;
      lVar10 = (local_5c8.m_cols + -7) * local_5c8.m_rows;
      dVar14 = local_5c8.m_data[lVar10 + 2] * (double)local_1a0.m_dst;
      lVar11 = (local_5c8.m_cols * 8 + -0x30) * local_5c8.m_rows;
      pdVar13 = (double *)((long)local_5c8.m_data + lVar11 + 0x10);
      lVar15 = 1;
      do {
        dVar14 = dVar14 + *pdVar13 * (double)(&local_1a0.m_dst)[lVar15];
        lVar15 = lVar15 + 1;
        pdVar13 = pdVar13 + local_5c8.m_rows;
      } while (lVar15 != 7);
      dVar17 = local_5c8.m_data[lVar10 + 5] * (double)local_1a0.m_dst;
      pdVar13 = (double *)((long)local_5c8.m_data + lVar11 + 0x28);
      lVar15 = 1;
      do {
        dVar17 = dVar17 + *pdVar13 * (double)(&local_1a0.m_dst)[lVar15];
        lVar15 = lVar15 + 1;
        pdVar13 = pdVar13 + local_5c8.m_rows;
      } while (lVar15 != 7);
      local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = -dVar17 / (double)pdVar1;
      dVar17 = local_5c8.m_data[lVar10 + 6] * (double)local_1a0.m_dst;
      pdVar13 = (double *)((long)local_5c8.m_data + lVar11 + 0x30);
      lVar10 = 1;
      do {
        dVar17 = dVar17 + *pdVar13 * (double)(&local_1a0.m_dst)[lVar10];
        lVar10 = lVar10 + 1;
        pdVar13 = pdVar13 + local_5c8.m_rows;
      } while (lVar10 != 7);
      local_538.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = -dVar17 / (double)pdVar1;
      local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_568.m_data[local_568.m_rows * 2] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows] * (double)local_1a0.m_dst -
                 *local_568.m_data * dVar14) + local_568.m_data[local_568.m_rows * 3];
      local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_568.m_data[local_568.m_rows * 2 + 1] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 1] * (double)local_1a0.m_dst -
                 local_568.m_data[1] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 1];
      local_538.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_568.m_data[local_568.m_rows * 2 + 2] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 2] * (double)local_1a0.m_dst -
                 local_568.m_data[2] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 2];
      local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_568.m_data[local_568.m_rows * 2 + 3] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 3] * (double)local_1a0.m_dst -
                 local_568.m_data[3] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 3];
      local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_568.m_data[local_568.m_rows * 2 + 4] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 4] * (double)local_1a0.m_dst -
                 local_568.m_data[4] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 4];
      local_538.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_568.m_data[local_568.m_rows * 2 + 5] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 5] * (double)local_1a0.m_dst -
                 local_568.m_data[5] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 5];
      local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_568.m_data[local_568.m_rows * 2 + 6] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 6] * (double)local_1a0.m_dst -
                 local_568.m_data[6] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 6];
      local_538.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_568.m_data[local_568.m_rows * 2 + 7] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 7] * (double)local_1a0.m_dst -
                 local_568.m_data[7] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 7];
      local_538.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_568.m_data[local_568.m_rows * 2 + 8] * (double)local_1a0.m_dstExpr +
                 (local_568.m_data[local_568.m_rows + 8] * (double)local_1a0.m_dst -
                 local_568.m_data[8] * dVar14) + local_568.m_data[local_568.m_rows * 3 + 8];
      local_538.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (double)local_1a0.m_dstExpr * local_568.m_data[local_568.m_rows * 2 + 9] +
                 ((double)local_1a0.m_dst * local_568.m_data[local_568.m_rows + 9] -
                 dVar14 * local_568.m_data[9]) + local_568.m_data[local_568.m_rows * 3 + 9];
      local_538.f = 1.0 / (double)pdVar1;
      std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::push_back
                (this,&local_538);
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 10);
  free(local_5c8.m_data);
  free(local_588.m_data);
  free(local_1c8.m_storage.m_data);
  free(local_568.m_data);
  free(local_168.m_data);
  free(local_550.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_5e0.data);
  free(local_5b0);
  return 0;
}

Assistant:

int R7PfrIter(const Eigen::MatrixXd &Xin, const Eigen::MatrixXd &uin, const Eigen::Vector3d &vk, double r0, RSDoublelinCameraPoseVector * results){

Eigen::MatrixXd X =  Xin.transpose();
Eigen::MatrixXd u =  uin.transpose();

results->reserve(10);

Eigen::MatrixXd A = Eigen::MatrixXd::Zero(7,11);


A.col(0) = -X.col(2).array() * u.col(0).array();
A.col(1) = -X.col(2).array() * u.col(1).array();
A.col(2) = X.col(0).array() * u.col(0).array() + X.col(1).array() * u.col(1).array();
A.col(3) = u.col(0).array() * (X.col(2).array() * (r0 - u.col(0).array()) - X.col(0).array() * vk(1) * (r0 - u.col(0).array()) + X.col(1).array() * vk(0) * (r0 - u.col(0).array()));
A.col(4) = u.col(1).array() * (X.col(2).array() * (r0 - u.col(0).array()) - X.col(0).array() * vk(1) * (r0 - u.col(0).array()) + X.col(1).array() * vk(0) * (r0 - u.col(0).array()));
A.col(5) = -u.col(0).array() * (X.col(0).array() * (r0 - u.col(0).array()) - X.col(1).array() * vk(2) * (r0 - u.col(0).array()) + X.col(2).array() * vk(1) * (r0 - u.col(0).array())) - u.col(1).array() * (X.col(1).array() * (r0 - u.col(0).array()) + X.col(0).array() * vk(2) * (r0 - u.col(0).array()) - X.col(2).array() * vk(0) * (r0 - u.col(0).array()));
A.col(6) = -u.col(1);
A.col(7) = u.col(0);
A.col(8) = u.col(1).array() * (r0 - u.col(0).array());
A.col(9) = -u.col(0).array() * (r0 - u.col(0).array());
A.col(10) = X.col(1).array() * u.col(0).array() - X.col(0).array() * u.col(1).array();



Eigen::MatrixXd nn = A.fullPivLu().kernel();

Eigen::MatrixXd n(10,4);

for ( int i = 0; i < 10; i++)
{
    n(i,0) = nn(i,0) - (nn(i,3) * nn(10,0)/nn(10,3));
    n(i,1) = nn(i,1) - (nn(i,3) * nn(10,1)/nn(10,3));
    n(i,2) = nn(i,2) - (nn(i,3) * nn(10,2)/nn(10,3));
    n(i,3) = nn(i,3)/nn(10,3);
}

Eigen::VectorXd r2 = u.col(0).array().pow(2)+u.col(1).array().pow(2);


Eigen::MatrixXd AA(7,14);

AA.col(0) = -u.col(1).array()*(X.col(1).array()*(n(3,0)*(r0 - u.col(0).array()) - n(0,0) + n(4,0)*vk(2)*(r0 - u.col(0).array())) + X.col(0).array()*(n(1,0) - n(4,0)*(r0 - u.col(0).array()) + n(3,0)*vk(2)*(r0 - u.col(0).array())) - X.col(2).array()*(n(3,0)*vk(0)*(r0 - u.col(0).array()) + n(4,0)*vk(1)*(r0 - u.col(0).array())));
AA.col(1) = r2.array()*(X.col(0).array()*(n(5,0)*(r0 - u.col(0).array()) - n(2,0) + n(3,0)*vk(1)*(r0 - u.col(0).array())) - n(7,0) + n(9,0)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,0) - n(3,0)*(r0 - u.col(0).array()) + n(5,0)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,0)*vk(0)*(r0 - u.col(0).array()) + n(5,0)*vk(2)*(r0 - u.col(0).array())));
AA.col(2) = X.col(0).array()*(n(5,0)*(r0 - u.col(0).array()) - n(2,0) + n(3,0)*vk(1)*(r0 - u.col(0).array())) - n(7,0) + n(9,0)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,0) - n(3,0)*(r0 - u.col(0).array()) + n(5,0)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,0)*vk(0)*(r0 - u.col(0).array()) + n(5,0)*vk(2)*(r0 - u.col(0).array()));
AA.col(3) = -u.col(1).array()*(X.col(1).array()*(n(3,1)*(r0 - u.col(0).array()) - n(0,1) + n(4,1)*vk(2)*(r0 - u.col(0).array())) + X.col(0).array()*(n(1,1) - n(4,1)*(r0 - u.col(0).array()) + n(3,1)*vk(2)*(r0 - u.col(0).array())) - X.col(2).array()*(n(3,1)*vk(0)*(r0 - u.col(0).array()) + n(4,1)*vk(1)*(r0 - u.col(0).array()))); 
AA.col(4) = r2.array()*(X.col(0).array()*(n(5,1)*(r0 - u.col(0).array()) - n(2,1) + n(3,1)*vk(1)*(r0 - u.col(0).array())) - n(7,1) + n(9,1)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,1) - n(3,1)*(r0 - u.col(0).array()) + n(5,1)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,1)*vk(0)*(r0 - u.col(0).array()) + n(5,1)*vk(2)*(r0 - u.col(0).array())));
AA.col(7) = X.col(0).array()*(n(5,1)*(r0 - u.col(0).array()) - n(2,1) + n(3,1)*vk(1)*(r0 - u.col(0).array())) - n(7,1) + n(9,1)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,1) - n(3,1)*(r0 - u.col(0).array()) + n(5,1)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,1)*vk(0)*(r0 - u.col(0).array()) + n(5,1)*vk(2)*(r0 - u.col(0).array()));
AA.col(8) = -u.col(1).array()*(X.col(1).array()*(n(3,2)*(r0 - u.col(0).array()) - n(0,2) + n(4,2)*vk(2)*(r0 - u.col(0).array())) + X.col(0).array()*(n(1,2) - n(4,2)*(r0 - u.col(0).array()) + n(3,2)*vk(2)*(r0 - u.col(0).array())) - X.col(2).array()*(n(3,2)*vk(0)*(r0 - u.col(0).array()) + n(4,2)*vk(1)*(r0 - u.col(0).array())));
AA.col(9) = r2.array()*(X.col(0).array()*(n(5,2)*(r0 - u.col(0).array()) - n(2,2) + n(3,2)*vk(1)*(r0 - u.col(0).array())) - n(7,2) + n(9,2)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,2) - n(3,2)*(r0 - u.col(0).array()) + n(5,2)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,2)*vk(0)*(r0 - u.col(0).array()) + n(5,2)*vk(2)*(r0 - u.col(0).array())));
AA.col(10) = X.col(0).array()*(n(5,2)*(r0 - u.col(0).array()) - n(2,2) + n(3,2)*vk(1)*(r0 - u.col(0).array())) - n(7,2) + n(9,2)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,2) - n(3,2)*(r0 - u.col(0).array()) + n(5,2)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,2)*vk(0)*(r0 - u.col(0).array()) + n(5,2)*vk(2)*(r0 - u.col(0).array()));
AA.col(5) = u.col(1).array();
AA.col(6) = -u.col(1).array()*(r0 - u.col(0).array());
AA.col(11) = -u.col(1).array()*(X.col(1).array()*(n(3,3)*(r0 - u.col(0).array()) - n(0,3) + n(4,3)*vk(2)*(r0 - u.col(0).array())) + X.col(0).array()*(n(1,3) - n(4,3)*(r0 - u.col(0).array()) + n(3,3)*vk(2)*(r0 - u.col(0).array())) - X.col(2).array()*(n(3,3)*vk(0)*(r0 - u.col(0).array()) + n(4,3)*vk(1)*(r0 - u.col(0).array()) + 1));
AA.col(12) = r2.array()*(X.col(0).array()*(n(5,3)*(r0 - u.col(0).array()) - n(2,3) + n(3,3)*vk(1)*(r0 - u.col(0).array())) - n(7,3) + n(9,3)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,3) - n(3,3)*(r0 - u.col(0).array()) + n(5,3)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,3)*vk(0)*(r0 - u.col(0).array()) + n(5,3)*vk(2)*(r0 - u.col(0).array()) + 1));
AA.col(13) = X.col(0).array()*(n(5,3)*(r0 - u.col(0).array()) - n(2,3) + n(3,3)*vk(1)*(r0 - u.col(0).array())) - n(7,3) + n(9,3)*(r0 - u.col(0).array()) + X.col(2).array()*(n(0,3) - n(3,3)*(r0 - u.col(0).array()) + n(5,3)*vk(1)*(r0 - u.col(0).array())) - X.col(1).array()*(n(3,3)*vk(0)*(r0 - u.col(0).array()) + n(5,3)*vk(2)*(r0 - u.col(0).array()) + 1);

Eigen::MatrixXd AR = AA.leftCols(7).lu().solve(AA);


Eigen::Matrix<double,35,1> data; 
data << AR.row(0).tail(7).transpose(), AR.row(1).tail(7).transpose(), AR.row(2).tail(7).transpose(), AR.row(3).tail(7).transpose(), AR.row(4).tail(7).transpose();


Eigen::Matrix<std::complex<double>, 4, 10> sols;


solver_R7Pfr(data, sols);

for (int i = 0; i < 10; i++)
{
    if(!std::isnan(sols(2,i).real()) & std::abs(sols(2,i).real()) > 1e-6 & std::abs(sols(2,i).imag()) < 1e-10){
        RSDoublelinCameraPose res;
        double f = sols(2,i).real();
        double b = sols(0,i).real();
        double c = sols(1,i).real();
        double rd = sols(3,i).real();

        Eigen::Matrix<double,7,1> mon; 
        mon << b, c*f, c*rd, c, f, rd, 1;
        double a = -AR.row(2).tail(7).dot(mon);
        res.C(2) = (-AR.row(5).tail(7).dot(mon))/f;
        res.t(2) = (-AR.row(6).tail(7).dot(mon))/f;
        res.v(0) = a*n(0,0)+b*n(0,1)+c*n(0,2)+n(0,3);
        res.v(1) = a*n(1,0)+b*n(1,1)+c*n(1,2)+n(1,3);
        res.v(2) = a*n(2,0)+b*n(2,1)+c*n(2,2)+n(2,3);
        res.w(0) = a*n(3,0)+b*n(3,1)+c*n(3,2)+n(3,3);
        res.w(1) = a*n(4,0)+b*n(4,1)+c*n(4,2)+n(4,3);
        res.w(2) = a*n(5,0)+b*n(5,1)+c*n(5,2)+n(5,3);
        res.C(0) = a*n(6,0)+b*n(6,1)+c*n(6,2)+n(6,3);
        res.C(1) = a*n(7,0)+b*n(7,1)+c*n(7,2)+n(7,3);
        res.t(0) = a*n(8,0)+b*n(8,1)+c*n(8,2)+n(8,3);
        res.t(1) = a*n(9,0)+b*n(9,1)+c*n(9,2)+n(9,3);
        res.f = 1/f;
        res.rd = rd;
        
        results->push_back(res);
    }
}



return 0;

}